

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkGeometryInstanceFlagsKHR
Diligent::InstanceFlagsToVkGeometryInstanceFlags(RAYTRACING_INSTANCE_FLAGS Flags)

{
  VkGeometryInstanceFlagsKHR VVar1;
  ulong uVar2;
  undefined7 in_register_00000039;
  byte bVar3;
  byte bVar4;
  string msg;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000039,Flags) == 0) {
    VVar1 = 0;
  }
  else {
    uVar2 = CONCAT71(in_register_00000039,Flags) & 0xffffffff;
    VVar1 = 0;
    do {
      bVar3 = (byte)uVar2;
      bVar4 = -bVar3 & bVar3;
      switch(bVar4) {
      case 1:
        VVar1 = VVar1 | 1;
        break;
      case 2:
        VVar1 = VVar1 | 2;
        break;
      default:
        FormatString<char[22]>(&local_50,(char (*) [22])"unknown instance flag");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"InstanceFlagsToVkGeometryInstanceFlags",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x707);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        break;
      case 4:
        VVar1 = VVar1 | 4;
        break;
      case 8:
        VVar1 = VVar1 | 8;
      }
      uVar2 = (ulong)(bVar4 ^ bVar3);
    } while (bVar4 != bVar3);
  }
  return VVar1;
}

Assistant:

VkGeometryInstanceFlagsKHR InstanceFlagsToVkGeometryInstanceFlags(RAYTRACING_INSTANCE_FLAGS Flags)
{
    static_assert(RAYTRACING_INSTANCE_FLAG_LAST == RAYTRACING_INSTANCE_FORCE_NO_OPAQUE,
                  "Please update the switch below to handle the new ray tracing instance flag");

    VkGeometryInstanceFlagsKHR Result = 0;
    while (Flags != RAYTRACING_INSTANCE_NONE)
    {
        RAYTRACING_INSTANCE_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_INSTANCE_TRIANGLE_FACING_CULL_DISABLE:    Result |= VK_GEOMETRY_INSTANCE_TRIANGLE_FACING_CULL_DISABLE_BIT_KHR;    break;
            case RAYTRACING_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE: Result |= VK_GEOMETRY_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE_BIT_KHR; break;
            case RAYTRACING_INSTANCE_FORCE_OPAQUE:                    Result |= VK_GEOMETRY_INSTANCE_FORCE_OPAQUE_BIT_KHR;                    break;
            case RAYTRACING_INSTANCE_FORCE_NO_OPAQUE:                 Result |= VK_GEOMETRY_INSTANCE_FORCE_NO_OPAQUE_BIT_KHR;                 break;
            // clang-format on
            default: UNEXPECTED("unknown instance flag");
        }
    }
    return Result;
}